

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_perf.c
# Opt level: O0

void write_is_done(void *vdata)

{
  void *in_RDI;
  int count;
  _free_struct *data;
  undefined4 local_14;
  
  free((void *)**(undefined8 **)((long)in_RDI + 8));
  if (*(long *)((long)in_RDI + 0x18) != 0) {
    for (local_14 = 0; local_14 < *(int *)((long)in_RDI + 0x10); local_14 = local_14 + 1) {
      if (*(long *)(*(long *)((long)in_RDI + 0x18) + (long)local_14 * 0x10) !=
          **(long **)((long)in_RDI + 8)) {
        free(*(void **)(*(long *)((long)in_RDI + 0x18) + (long)local_14 * 0x10));
        *(undefined8 *)(*(long *)((long)in_RDI + 0x18) + (long)local_14 * 0x10) = 0;
      }
    }
    free(*(void **)((long)in_RDI + 0x18));
  }
  free(*(void **)((long)in_RDI + 8));
  free(in_RDI);
  return;
}

Assistant:

static void
write_is_done(void *vdata)
{
    struct _free_struct *data = (struct _free_struct *)vdata;
    int count;

    free(data->write_vec[0].iov_base);
    if (data->tmp_vec) {
	for (count = 0; count < data->vecs; count++) {
	    if (data->tmp_vec[count].iov_base == data->write_vec[0].iov_base) {
		continue;
	    }
	    free(data->tmp_vec[count].iov_base);
	    data->tmp_vec[count].iov_base = NULL;
	}
	free(data->tmp_vec);
    }
    free(data->write_vec);
    free(data);
}